

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

_Bool Curl_conn_is_multiplex(connectdata *conn,int sockindex)

{
  Curl_cfilter *local_30;
  Curl_cfilter *local_28;
  Curl_cfilter *cf;
  int sockindex_local;
  connectdata *conn_local;
  
  if (conn == (connectdata *)0x0) {
    local_30 = (Curl_cfilter *)0x0;
  }
  else {
    local_30 = conn->cfilter[sockindex];
  }
  local_28 = local_30;
  while( true ) {
    if (local_28 == (Curl_cfilter *)0x0) {
      return false;
    }
    if ((local_28->cft->flags & 4U) != 0) break;
    if ((local_28->cft->flags & 3U) != 0) {
      return false;
    }
    local_28 = local_28->next;
  }
  return true;
}

Assistant:

bool Curl_conn_is_multiplex(struct connectdata *conn, int sockindex)
{
  struct Curl_cfilter *cf = conn ? conn->cfilter[sockindex] : NULL;

  for(; cf; cf = cf->next) {
    if(cf->cft->flags & CF_TYPE_MULTIPLEX)
      return TRUE;
    if(cf->cft->flags & (CF_TYPE_IP_CONNECT|CF_TYPE_SSL))
      return FALSE;
  }
  return FALSE;
}